

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseOperatorName(State *state,int *arity)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  undefined **local_60;
  AbbrevPair *p;
  ParseState copy;
  ComplexityGuard local_28;
  ComplexityGuard guard;
  int *arity_local;
  State *state_local;
  
  guard.state_ = (State *)arity;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_28,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_28);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    pcVar5 = RemainingInput(state);
    bVar4 = AtLeastNumCharsRemaining(pcVar5,2);
    if (bVar4) {
      uVar1 = (state->parse_state).mangled_idx;
      uVar2 = (state->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(state->parse_state).prev_name_idx;
      bVar4 = ParseTwoCharToken(state,"cv");
      if ((((bVar4) && (bVar4 = MaybeAppend(state,"operator "), bVar4)) &&
          (bVar4 = EnterNestedName(state), bVar4)) &&
         (bVar4 = ParseConversionOperatorType(state), bVar4)) {
        copy.out_cur_idx = (int)((ulong)uVar3 >> 0x20);
        bVar4 = LeaveNestedName(state,(short)(copy.out_cur_idx * 2 >> 0x11));
        if (bVar4) {
          if (guard.state_ != (State *)0x0) {
            *(undefined4 *)&(guard.state_)->mangled_begin = 1;
          }
          state_local._7_1_ = true;
          goto LAB_001076e8;
        }
      }
      (state->parse_state).mangled_idx = uVar1;
      (state->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar3;
      bVar4 = ParseTwoCharToken(state,"li");
      if (((bVar4) && (bVar4 = MaybeAppend(state,"operator\"\" "), bVar4)) &&
         (bVar4 = ParseSourceName(state), bVar4)) {
        state_local._7_1_ = true;
      }
      else {
        (state->parse_state).mangled_idx = uVar1;
        (state->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseOneCharToken(state,'v');
        if (((bVar4) && (bVar4 = ParseDigit(state,(int *)guard.state_), bVar4)) &&
           (bVar4 = ParseSourceName(state), bVar4)) {
          state_local._7_1_ = true;
        }
        else {
          (state->parse_state).mangled_idx = uVar1;
          (state->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar3;
          pcVar5 = RemainingInput(state);
          bVar4 = IsLower(*pcVar5);
          if (bVar4) {
            pcVar5 = RemainingInput(state);
            bVar4 = IsAlpha(pcVar5[1]);
            if (bVar4) {
              for (local_60 = &kOperatorList; *local_60 != (undefined *)0x0; local_60 = local_60 + 3
                  ) {
                pcVar5 = RemainingInput(state);
                if ((*pcVar5 == **local_60) &&
                   (pcVar5 = RemainingInput(state), pcVar5[1] == (*local_60)[1])) {
                  if (guard.state_ != (State *)0x0) {
                    *(undefined4 *)&(guard.state_)->mangled_begin = *(undefined4 *)(local_60 + 2);
                  }
                  MaybeAppend(state,"operator");
                  bVar4 = IsLower(*local_60[1]);
                  if (bVar4) {
                    MaybeAppend(state," ");
                  }
                  MaybeAppend(state,local_60[1]);
                  (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 2;
                  anon_unknown_3::UpdateHighWaterMark(state);
                  state_local._7_1_ = true;
                  goto LAB_001076e8;
                }
              }
              state_local._7_1_ = false;
              goto LAB_001076e8;
            }
          }
          state_local._7_1_ = false;
        }
      }
    }
    else {
      state_local._7_1_ = false;
    }
  }
LAB_001076e8:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_28);
  return state_local._7_1_;
}

Assistant:

static bool ParseOperatorName(State *state, int *arity) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (!AtLeastNumCharsRemaining(RemainingInput(state), 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "cv") && MaybeAppend(state, "operator ") &&
      EnterNestedName(state) && ParseConversionOperatorType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    if (arity != nullptr) {
      *arity = 1;
    }
    return true;
  }
  state->parse_state = copy;

  // Then user-defined literals.
  if (ParseTwoCharToken(state, "li") && MaybeAppend(state, "operator\"\" ") &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseDigit(state, arity) &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(RemainingInput(state)[0]) &&
        IsAlpha(RemainingInput(state)[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != nullptr; ++p) {
    if (RemainingInput(state)[0] == p->abbrev[0] &&
        RemainingInput(state)[1] == p->abbrev[1]) {
      if (arity != nullptr) {
        *arity = p->arity;
      }
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->parse_state.mangled_idx += 2;
      UpdateHighWaterMark(state);
      return true;
    }
  }
  return false;
}